

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

float Rml::ComputeLength(NumericValue value,float font_size,float document_font_size,float dp_ratio,
                        Vector2f vp_dimensions)

{
  code *pcVar1;
  int line;
  bool bVar2;
  Unit UVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = value.number;
  UVar3 = value.unit;
  if (((ulong)value >> 0x20 & 0x3e000) == 0) {
    if (UVar3 == PX) {
      return fVar4;
    }
    if (UVar3 == DP) {
      return fVar4 * dp_ratio;
    }
    fVar5 = vp_dimensions.x;
    if ((UVar3 == VW) || (fVar5 = vp_dimensions.y, UVar3 == VH)) {
      return fVar5 * fVar4 * 0.01;
    }
    if (UVar3 == REM) {
      return fVar4 * document_font_size;
    }
    if (UVar3 == EM) {
      return fVar4 * font_size;
    }
    line = 0x60;
  }
  else {
    fVar4 = fVar4 * 96.0 * dp_ratio;
    if (UVar3 == INCH) {
      return fVar4;
    }
    if (UVar3 == PC) {
      return fVar4 * 0.16666667;
    }
    if (UVar3 == MM) {
      return fVar4 * 0.03937008;
    }
    if (UVar3 == PT) {
      return fVar4 * 0.013888889;
    }
    if (UVar3 == CM) {
      return fVar4 * 0.39370078;
    }
    line = 0x4c;
  }
  bVar2 = Assert("RMLUI_ERROR",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                 ,line);
  if (bVar2) {
    return 0.0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

float ComputeLength(NumericValue value, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(value.unit & Unit::PPI_UNIT))
		return ComputePPILength(value, dp_ratio);

	switch (value.unit)
	{
	case Unit::PX: return value.number;
	case Unit::EM: return value.number * font_size;
	case Unit::REM: return value.number * document_font_size;
	case Unit::DP: return value.number * dp_ratio;
	case Unit::VW: return value.number * vp_dimensions.x * 0.01f;
	case Unit::VH: return value.number * vp_dimensions.y * 0.01f;
	default: break;
	}

	RMLUI_ERROR;
	return 0.0f;
}